

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobalInitExpr_GlobalGet
          (SharedValidator *this,Location *loc,Var *ref_global_var)

{
  Result RVar1;
  Enum EVar2;
  char *pcVar3;
  int __c;
  Var *__s;
  bool bVar4;
  GlobalType ref_global;
  Var local_78;
  
  ref_global.type.enum_ = Any;
  ref_global.mutable_ = true;
  Var::Var(&local_78,ref_global_var);
  __s = &local_78;
  RVar1 = CheckGlobalIndex(this,&local_78,&ref_global);
  Var::~Var(&local_78);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    pcVar3 = Var::index(ref_global_var,(char *)__s,__c);
    bVar4 = false;
    if (this->num_imported_globals_ <= (uint)pcVar3) {
      RVar1 = PrintError(this,&ref_global_var->loc,
                         "initializer expression can only reference an imported global");
      bVar4 = RVar1.enum_ == Error;
    }
    if (ref_global.mutable_ == true) {
      RVar1 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      bVar4 = (bool)(RVar1.enum_ == Error | bVar4);
    }
    RVar1 = CheckType(this,loc,ref_global.type,
                      (Type)(this->globals_).
                            super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].type.enum_,
                      "global initializer expression");
    EVar2 = (Enum)(byte)(RVar1.enum_ == Error | bVar4);
  }
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnGlobalInitExpr_GlobalGet(const Location& loc,
                                                   Var ref_global_var) {
  Result result = Result::Ok;
  GlobalType ref_global;
  CHECK_RESULT(CheckGlobalIndex(ref_global_var, &ref_global));

  if (ref_global_var.index() >= num_imported_globals_) {
    result |= PrintError(
        ref_global_var.loc,
        "initializer expression can only reference an imported global");
  }

  if (ref_global.mutable_) {
    result |= PrintError(
        loc, "initializer expression cannot reference a mutable global");
  }

  result |= CheckType(loc, ref_global.type, globals_.back().type,
                      "global initializer expression");
  return result;
}